

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::
SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
::~SingleValueGenerator
          (SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
           *this)

{
  std::__cxx11::string::~string((string *)&this->m_value);
  GeneratorUntypedBase::~GeneratorUntypedBase((GeneratorUntypedBase *)this);
  return;
}

Assistant:

SingleValueGenerator(T&& value) : m_value(std::move(value)) {}